

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::SocketAddress::SocketAddress(SocketAddress *this,void *sockaddr,uint len)

{
  bool bVar1;
  Fault local_60;
  Fault f;
  uint *local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  uint len_local;
  void *sockaddr_local;
  SocketAddress *this_local;
  
  this->addrlen = len;
  this->wildcard = false;
  _kjCondition._36_4_ = len;
  local_50 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (uint *)&_kjCondition.field_0x24);
  f.exception = (Exception *)0x80;
  kj::_::DebugExpression<unsigned_int&>::operator<=
            ((DebugComparison<unsigned_int_&,_unsigned_long> *)local_48,
             (DebugExpression<unsigned_int&> *)&local_50,(unsigned_long *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&,char_const(&)[40]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x37c,FAILED,"len <= sizeof(addr)",
               "_kjCondition,\"Sorry, your sockaddr is too big for me.\"",
               (DebugComparison<unsigned_int_&,_unsigned_long> *)local_48,
               (char (*) [40])"Sorry, your sockaddr is too big for me.");
    kj::_::Debug::Fault::fatal(&local_60);
  }
  memcpy(&this->addr,sockaddr,(ulong)(uint)_kjCondition._36_4_);
  return;
}

Assistant:

SocketAddress(const void* sockaddr, uint len): addrlen(len) {
    KJ_REQUIRE(len <= sizeof(addr), "Sorry, your sockaddr is too big for me.");
    memcpy(&addr.generic, sockaddr, len);
  }